

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Window.cxx
# Opt level: O3

void __thiscall Fl_Menu_Window::show(Fl_Menu_Window *this)

{
  byte bVar1;
  Fl_X *pFVar2;
  Fl_Image *pFVar3;
  ulong uVar4;
  
  pFVar3 = Fl::scheme_bg_;
  (this->super_Fl_Single_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget.label_.image =
       Fl::scheme_bg_;
  if (pFVar3 != (Fl_Image *)0x0) {
    (this->super_Fl_Single_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget.label_.align_ =
         0x50;
  }
  (this->super_Fl_Single_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget.label_.type =
       pFVar3 == (Fl_Image *)0x0;
  (*Fl_Tooltip::exit)((Fl_Widget *)this);
  pFVar2 = (this->super_Fl_Single_Window).super_Fl_Window.i;
  if (pFVar2 == (Fl_X *)0x0) {
    fl_open_display();
    if (((this->super_Fl_Single_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget.type_ != 0xf1
        ) && (bVar1 = (this->super_Fl_Single_Window).super_Fl_Window.super_Fl_Group.super_Fl_Widget.
                      box_, bVar1 == 1 || (bVar1 & 0xf2) == 2)) {
      uVar4 = fl_xpixel((this->super_Fl_Single_Window).super_Fl_Window.super_Fl_Group.
                        super_Fl_Widget.color_);
      fl_background_pixel = (int)uVar4;
    }
    Fl_X::make_xid((Fl_Window *)this,fl_visual,fl_colormap);
    return;
  }
  XMapRaised(fl_display,pFVar2->xid);
  return;
}

Assistant:

void Fl_Menu_Window::show() {
#if HAVE_OVERLAY
  if (!shown() && overlay() && fl_find_overlay_visual()) {
    XInstallColormap(fl_display, fl_overlay_colormap);
    fl_background_pixel = int(fl_transparent_pixel);
    Fl_X::make_xid(this, fl_overlay_visual, fl_overlay_colormap);
    fl_background_pixel = -1;
  } else
#endif
    Fl_Single_Window::show();
}